

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_absolute_x_instructions.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::NopAbsoluteXFixture_nop_absx_Test::~NopAbsoluteXFixture_nop_absx_Test
          (NopAbsoluteXFixture_nop_absx_Test *this)

{
  void *in_RAX;
  
  *(undefined ***)(this + -0x118) = &PTR__CpuTest_002a07b0;
  testing::InSequence::~InSequence((InSequence *)(this + -8));
  if (*(long **)(this + -0x18) != (long *)0x0) {
    (**(code **)(**(long **)(this + -0x18) + 8))();
  }
  *(undefined8 *)(this + -0x18) = 0;
  *(undefined ***)(this + -0x100) = &PTR__MockMmu_002a0898;
  testing::internal::FunctionMocker<void_(unsigned_short,_unsigned_char)>::~FunctionMocker
            ((FunctionMocker<void_(unsigned_short,_unsigned_char)> *)(this + -0x68));
  testing::internal::FunctionMocker<unsigned_char_(unsigned_short)>::~FunctionMocker
            ((FunctionMocker<unsigned_char_(unsigned_short)> *)(this + -0xb0));
  testing::internal::
  FunctionMocker<void_(std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>)>
  ::~FunctionMocker((FunctionMocker<void_(std::vector<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>,_std::allocator<std::unique_ptr<n_e_s::core::IMemBank,_std::default_delete<n_e_s::core::IMemBank>_>_>_>)>
                     *)(this + -0xf8));
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)(this + -0x118));
  operator_delete((Test *)(this + -0x118),0x120);
  return;
}

Assistant:

TEST_P(NopAbsoluteXFixture, nop_absx) {
    stage_instruction(GetParam());
    expected.pc += 2;

    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0x34));
    EXPECT_CALL(mmu, read_byte(registers.pc + 2)).WillOnce(Return(0x12));

    step_execution(4);
    EXPECT_EQ(expected, registers);
}